

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O2

int TIFFRGBAImageOK(TIFF *tif,char *emsg)

{
  ushort uVar1;
  int iVar2;
  undefined8 in_RAX;
  char *pcVar3;
  char *pcVar4;
  int iVar5;
  ushort uVar6;
  ulong uVar7;
  char *pcVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  undefined4 uStack_28;
  uint16_t photometric;
  uint16_t inkset;
  
  if (tif->tif_decodestatus == 0) {
    builtin_strncpy(emsg,"Sorry, requested compression method is not configured",0x36);
    return 0;
  }
  uVar10 = (uint)(tif->tif_dir).td_bitspersample;
  if ((0x10 < uVar10) || ((0x10116U >> (uVar10 & 0x1f) & 1) == 0)) {
    snprintf(emsg,0x400,"Sorry, can not handle images with %u-bit samples");
    return 0;
  }
  if ((tif->tif_dir).td_sampleformat == 3) {
    builtin_strncpy(emsg,"Sorry, can not handle images with IEEE floating-point samples",0x3e);
    return 0;
  }
  uVar10 = (uint)(tif->tif_dir).td_samplesperpixel - (uint)(tif->tif_dir).td_extrasamples;
  uVar9 = (ulong)uVar10;
  _uStack_28 = in_RAX;
  iVar2 = TIFFGetField(tif,0x106,&photometric);
  uVar11 = 1;
  iVar5 = 1;
  if (iVar2 == 0) {
    if (uVar10 == 3) {
      return 1;
    }
    if (uVar10 != 1) {
      snprintf(emsg,0x400,"Missing needed %s tag","PhotometricInterpretation");
      return 0;
    }
    _uStack_28 = CONCAT24(1,uStack_28);
    uVar6 = 1;
switchD_0025a5a3_caseD_0:
    if ((tif->tif_dir).td_planarconfig != 1) {
      return 1;
    }
    uVar1 = (tif->tif_dir).td_samplesperpixel;
    uVar9 = (ulong)uVar1;
    if (uVar1 == 1) {
      return 1;
    }
    uVar1 = (tif->tif_dir).td_bitspersample;
    uVar11 = (ulong)uVar1;
    if (7 < uVar1) {
      return 1;
    }
    pcVar4 = "Sorry, can not handle contiguous data with %s=%u, and %s=%u and Bits/Sample=%u";
    pcVar3 = "PhotometricInterpretation";
    pcVar8 = "Samples/pixel";
LAB_0025a664:
    snprintf(emsg,0x400,pcVar4,pcVar3,(ulong)uVar6,pcVar8,uVar9,uVar11);
    return 0;
  }
  uVar7 = (ulong)photometric;
  uVar6 = photometric;
  switch(uVar7) {
  case 0:
  case 1:
  case 3:
    goto switchD_0025a5a3_caseD_0;
  case 2:
    if (2 < (int)uVar10) {
      return 1;
    }
    pcVar4 = "Sorry, can not handle RGB image with %s=%d";
    pcVar3 = "Color channels";
    uVar7 = (ulong)uVar10;
    break;
  case 4:
  case 7:
switchD_0025a5a3_caseD_4:
    pcVar4 = "Sorry, can not handle image with %s=%u";
    pcVar3 = "PhotometricInterpretation";
    break;
  case 5:
    TIFFGetFieldDefaulted(tif,0x14c,&inkset);
    if (inkset == 1) {
      if (3 < (tif->tif_dir).td_samplesperpixel) {
        return 1;
      }
      pcVar4 = "Sorry, can not handle separated image with %s=%u";
      pcVar3 = "Samples/pixel";
    }
    else {
      pcVar4 = "Sorry, can not handle separated image with %s=%d";
      pcVar3 = "InkSet";
    }
    snprintf(emsg,0x400,pcVar4,pcVar3);
    return 0;
  case 6:
    goto switchD_0025a5a3_caseD_6;
  case 8:
    uVar6 = (tif->tif_dir).td_samplesperpixel;
    uVar1 = (tif->tif_dir).td_bitspersample;
    if (uVar10 == 3 && uVar6 == 3) {
      if (uVar1 == 8) {
        return 1;
      }
      if (uVar1 == 0x10) {
        return 1;
      }
    }
    snprintf(emsg,0x400,"Sorry, can not handle image with %s=%u, %s=%d and %s=%u","Samples/pixel",
             (ulong)uVar6,"colorchannels",uVar9,"Bits/sample",(ulong)uVar1);
    return 0;
  default:
    if (photometric == 0x804c) {
      if ((tif->tif_dir).td_compression == 0x8774) {
        return 1;
      }
      pcVar4 = "Sorry, LogL data must have %s=%d";
      pcVar3 = "Compression";
      uVar7 = 0x8774;
    }
    else {
      if (photometric != 0x804d) goto switchD_0025a5a3_caseD_4;
      if (((tif->tif_dir).td_compression & 0xfffe) != 0x8774) {
        snprintf(emsg,0x400,"Sorry, LogLuv data must have %s=%d or %d","Compression",0x8774,0x8775);
        return 0;
      }
      uVar6 = (tif->tif_dir).td_planarconfig;
      uVar7 = (ulong)uVar6;
      if (uVar6 == 1) {
        uVar6 = (tif->tif_dir).td_samplesperpixel;
        if (uVar10 == 3 && uVar6 == 3) {
          return 1;
        }
        pcVar4 = "Sorry, can not handle image with %s=%u, %s=%d";
        pcVar3 = "Samples/pixel";
        pcVar8 = "colorchannels";
        goto LAB_0025a664;
      }
      pcVar4 = "Sorry, can not handle LogLuv images with %s=%u";
      pcVar3 = "Planarconfiguration";
    }
  }
  iVar5 = 0;
  snprintf(emsg,0x400,pcVar4,pcVar3,uVar7);
switchD_0025a5a3_caseD_6:
  return iVar5;
}

Assistant:

int TIFFRGBAImageOK(TIFF *tif, char emsg[EMSG_BUF_SIZE])
{
    TIFFDirectory *td = &tif->tif_dir;
    uint16_t photometric;
    int colorchannels;

    if (!tif->tif_decodestatus)
    {
        snprintf(emsg, EMSG_BUF_SIZE,
                 "Sorry, requested compression method is not configured");
        return (0);
    }
    switch (td->td_bitspersample)
    {
        case 1:
        case 2:
        case 4:
        case 8:
        case 16:
            break;
        default:
            snprintf(emsg, EMSG_BUF_SIZE,
                     "Sorry, can not handle images with %" PRIu16
                     "-bit samples",
                     td->td_bitspersample);
            return (0);
    }
    if (td->td_sampleformat == SAMPLEFORMAT_IEEEFP)
    {
        snprintf(
            emsg, EMSG_BUF_SIZE,
            "Sorry, can not handle images with IEEE floating-point samples");
        return (0);
    }
    colorchannels = td->td_samplesperpixel - td->td_extrasamples;
    if (!TIFFGetField(tif, TIFFTAG_PHOTOMETRIC, &photometric))
    {
        switch (colorchannels)
        {
            case 1:
                photometric = PHOTOMETRIC_MINISBLACK;
                break;
            case 3:
                photometric = PHOTOMETRIC_RGB;
                break;
            default:
                snprintf(emsg, EMSG_BUF_SIZE, "Missing needed %s tag",
                         photoTag);
                return (0);
        }
    }
    switch (photometric)
    {
        case PHOTOMETRIC_MINISWHITE:
        case PHOTOMETRIC_MINISBLACK:
        case PHOTOMETRIC_PALETTE:
            if (td->td_planarconfig == PLANARCONFIG_CONTIG &&
                td->td_samplesperpixel != 1 && td->td_bitspersample < 8)
            {
                snprintf(
                    emsg, EMSG_BUF_SIZE,
                    "Sorry, can not handle contiguous data with %s=%" PRIu16
                    ", "
                    "and %s=%" PRIu16 " and Bits/Sample=%" PRIu16 "",
                    photoTag, photometric, "Samples/pixel",
                    td->td_samplesperpixel, td->td_bitspersample);
                return (0);
            }
            /*
             * We should likely validate that any extra samples are either
             * to be ignored, or are alpha, and if alpha we should try to use
             * them.  But for now we won't bother with this.
             */
            break;
        case PHOTOMETRIC_YCBCR:
            /*
             * TODO: if at all meaningful and useful, make more complete
             * support check here, or better still, refactor to let supporting
             * code decide whether there is support and what meaningful
             * error to return
             */
            break;
        case PHOTOMETRIC_RGB:
            if (colorchannels < 3)
            {
                snprintf(emsg, EMSG_BUF_SIZE,
                         "Sorry, can not handle RGB image with %s=%d",
                         "Color channels", colorchannels);
                return (0);
            }
            break;
        case PHOTOMETRIC_SEPARATED:
        {
            uint16_t inkset;
            TIFFGetFieldDefaulted(tif, TIFFTAG_INKSET, &inkset);
            if (inkset != INKSET_CMYK)
            {
                snprintf(emsg, EMSG_BUF_SIZE,
                         "Sorry, can not handle separated image with %s=%d",
                         "InkSet", inkset);
                return 0;
            }
            if (td->td_samplesperpixel < 4)
            {
                snprintf(
                    emsg, EMSG_BUF_SIZE,
                    "Sorry, can not handle separated image with %s=%" PRIu16,
                    "Samples/pixel", td->td_samplesperpixel);
                return 0;
            }
            break;
        }
        case PHOTOMETRIC_LOGL:
            if (td->td_compression != COMPRESSION_SGILOG)
            {
                snprintf(emsg, EMSG_BUF_SIZE,
                         "Sorry, LogL data must have %s=%d", "Compression",
                         COMPRESSION_SGILOG);
                return (0);
            }
            break;
        case PHOTOMETRIC_LOGLUV:
            if (td->td_compression != COMPRESSION_SGILOG &&
                td->td_compression != COMPRESSION_SGILOG24)
            {
                snprintf(emsg, EMSG_BUF_SIZE,
                         "Sorry, LogLuv data must have %s=%d or %d",
                         "Compression", COMPRESSION_SGILOG,
                         COMPRESSION_SGILOG24);
                return (0);
            }
            if (td->td_planarconfig != PLANARCONFIG_CONTIG)
            {
                snprintf(emsg, EMSG_BUF_SIZE,
                         "Sorry, can not handle LogLuv images with %s=%" PRIu16,
                         "Planarconfiguration", td->td_planarconfig);
                return (0);
            }
            if (td->td_samplesperpixel != 3 || colorchannels != 3)
            {
                snprintf(emsg, EMSG_BUF_SIZE,
                         "Sorry, can not handle image with %s=%" PRIu16
                         ", %s=%d",
                         "Samples/pixel", td->td_samplesperpixel,
                         "colorchannels", colorchannels);
                return 0;
            }
            break;
        case PHOTOMETRIC_CIELAB:
            if (td->td_samplesperpixel != 3 || colorchannels != 3 ||
                (td->td_bitspersample != 8 && td->td_bitspersample != 16))
            {
                snprintf(emsg, EMSG_BUF_SIZE,
                         "Sorry, can not handle image with %s=%" PRIu16
                         ", %s=%d and %s=%" PRIu16,
                         "Samples/pixel", td->td_samplesperpixel,
                         "colorchannels", colorchannels, "Bits/sample",
                         td->td_bitspersample);
                return 0;
            }
            break;
        default:
            snprintf(emsg, EMSG_BUF_SIZE,
                     "Sorry, can not handle image with %s=%" PRIu16, photoTag,
                     photometric);
            return (0);
    }
    return (1);
}